

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

void __thiscall
google::protobuf::RepeatedField<long>::AddAlreadyReserved(RepeatedField<long> *this,long *value)

{
  int iVar1;
  long lVar2;
  
  lVar2 = *value;
  iVar1 = this->current_size_;
  this->current_size_ = iVar1 + 1;
  *(long *)((long)this->arena_or_elements_ + (long)iVar1 * 8) = lVar2;
  return;
}

Assistant:

inline void RepeatedField<Element>::AddAlreadyReserved(const Element& value) {
  GOOGLE_DCHECK_LT(current_size_, total_size_);
  elements()[current_size_++] = value;
}